

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_console_outputter.hpp
# Opt level: O2

void __thiscall
hayai::ConsoleOutputter::BeginOrSkipTest
          (ConsoleOutputter *this,string *fixtureName,string *testName,
          TestParametersDescriptor *parameters,size_t *runsCount,size_t *iterationsCount,bool skip)

{
  size_t *psVar1;
  ostream *poVar2;
  char *pcVar3;
  TextColor local_3c;
  size_t *local_38;
  
  local_38 = iterationsCount;
  if (skip) {
    local_3c = TextCyan;
    poVar2 = operator<<(this->_stream,&local_3c);
    pcVar3 = "[ DISABLED ]";
  }
  else {
    local_3c = TextGreen;
    poVar2 = operator<<(this->_stream,&local_3c);
    pcVar3 = "[ RUN      ]";
  }
  std::operator<<(poVar2,pcVar3);
  local_3c = TextYellow;
  poVar2 = operator<<(this->_stream,&local_3c);
  std::operator<<(poVar2," ");
  Outputter::WriteTestNameToStream(this->_stream,fixtureName,testName,parameters);
  local_3c = TextDefault;
  poVar2 = operator<<(this->_stream,&local_3c);
  poVar2 = std::operator<<(poVar2," (");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  pcVar3 = " runs, ";
  if (*runsCount == 1) {
    pcVar3 = " run, ";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  psVar1 = local_38;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  pcVar3 = " iterations per run)";
  if (*psVar1 == 1) {
    pcVar3 = " iteration per run)";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

inline void BeginOrSkipTest(const std::string& fixtureName,
                                    const std::string& testName,
                                    const TestParametersDescriptor& parameters,
                                    const std::size_t& runsCount,
                                    const std::size_t& iterationsCount,
                                    const bool skip)
        {
            if (skip)
                _stream << Console::TextCyan << "[ DISABLED ]";
            else
                _stream << Console::TextGreen << "[ RUN      ]";

            _stream << Console::TextYellow << " ";
            WriteTestNameToStream(_stream, fixtureName, testName, parameters);
            _stream << Console::TextDefault
                    << " (" << runsCount
                    << (runsCount == 1 ? " run, " : " runs, ")
                    << iterationsCount
                    << (iterationsCount == 1 ?
                        " iteration per run)" :
                        " iterations per run)")
                    << std::endl;
        }